

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_merge.hpp
# Opt level: O2

unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> * __thiscall
optimization::const_merge::Env::get_inst(Env *this,pair<int,_int> pair)

{
  mapped_type *pmVar1;
  reference pvVar2;
  pair<int,_int> local_10;
  
  local_10 = pair;
  pmVar1 = std::
           map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
           ::at(&this->func->basic_blks,&local_10.first);
  pvVar2 = std::
           vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           ::at(&pmVar1->inst,(long)local_10.second);
  return pvVar2;
}

Assistant:

std::unique_ptr<mir::inst::Inst>& get_inst(
      std::pair<mir::types::LabelId, int> pair) {
    return func.basic_blks.at(pair.first).inst.at(pair.second);
  }